

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetBlockInfo(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)> local_58;
  function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)> local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)>::
  function<cfd::js::api::BlockInformationStruct(&)(cfd::js::api::BlockDataStruct_const&),void>
            ((function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)> *
             )&local_38,BlockStructApi::GetBlockInfo);
  std::function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)>::
  function<cfd::js::api::BlockInformationStruct(&)(cfd::js::api::BlockDataStruct_const&),void>
            ((function<cfd::js::api::BlockInformationStruct(cfd::js::api::BlockDataStruct_const&)> *
             )&local_58,ElementsBlockStructApi::GetBlockInfo);
  ExecuteElementsCheckApi<cfd::js::api::json::BlockData,cfd::js::api::json::BlockInformation,cfd::js::api::BlockDataStruct,cfd::js::api::BlockInformationStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)>::
  ~function(&local_58);
  std::function<cfd::js::api::BlockInformationStruct_(const_cfd::js::api::BlockDataStruct_&)>::
  ~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetBlockInfo(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::BlockData, api::json::BlockInformation, api::BlockDataStruct,
      api::BlockInformationStruct>(
      request_message, BlockStructApi::GetBlockInfo,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsBlockStructApi::GetBlockInfo);
#else
      BlockStructApi::GetBlockInfo);
#endif
}